

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# questpgr.c
# Opt level: O0

void com_pager(int msgnum)

{
  qtmsg *qt_msg_00;
  qtmsg *qt_msg;
  int msgnum_local;
  
  qt_msg_00 = msg_in(qt_list.common,msgnum);
  if (qt_msg_00 == (qtmsg *)0x0) {
    warning("com_pager: message %d not found.",(ulong)(uint)msgnum);
  }
  else {
    dlb_fseek(msg_file,qt_msg_00->offset,0);
    if (qt_msg_00->delivery == 'p') {
      deliver_by_pline(qt_msg_00);
    }
    else {
      deliver_by_window(qt_msg_00);
    }
  }
  return;
}

Assistant:

void com_pager(int msgnum)
{
	struct qtmsg *qt_msg;

	if (!(qt_msg = msg_in(qt_list.common, msgnum))) {
		warning("com_pager: message %d not found.", msgnum);
		return;
	}

	dlb_fseek(msg_file, qt_msg->offset, SEEK_SET);
	if (qt_msg->delivery == 'p') deliver_by_pline(qt_msg);
	else deliver_by_window(qt_msg);
	return;
}